

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather_test.c
# Opt level: O1

REF_STATUS ref_gather_meshb_fixture(REF_MPI ref_mpi,char *filename,REF_INT version)

{
  REF_GEOM ref_geom;
  uint uVar1;
  REF_GRID_conflict ref_grid;
  REF_DBL param [2];
  REF_INT cell;
  REF_INT nodes [27];
  REF_GRID local_d0;
  REF_DBL local_c8 [3];
  REF_INT local_ac;
  REF_INT local_a8 [30];
  
  if (ref_mpi->id == 0) {
    uVar1 = ref_fixture_tet_brick_grid(&local_d0,ref_mpi);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x37,"ref_gather_meshb_fixture",(ulong)uVar1,"set up tet");
      return uVar1;
    }
    local_d0->meshb_version = version;
    ref_geom = local_d0->geom;
    local_a8[0] = 0;
    local_a8[1] = 1;
    local_a8[2] = 0xf;
    uVar1 = ref_cell_add(local_d0->cell[0],local_a8,&local_ac);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x3d,"ref_gather_meshb_fixture",(ulong)uVar1,"add edge");
      return uVar1;
    }
    uVar1 = ref_geom_add(ref_geom,0,0,1,local_c8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x41,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom node");
      return uVar1;
    }
    uVar1 = ref_geom_add(ref_geom,1,0,2,local_c8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x44,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom node");
      return uVar1;
    }
    local_c8[0] = 10.0;
    uVar1 = ref_geom_add(ref_geom,0,1,0xf,local_c8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x49,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom edge");
      return uVar1;
    }
    local_c8[0] = 20.0;
    uVar1 = ref_geom_add(ref_geom,1,1,0xf,local_c8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x4d,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom edge");
      return uVar1;
    }
    local_c8[0] = 10.0;
    local_c8[1] = 20.0;
    uVar1 = ref_geom_add(ref_geom,0,2,3,local_c8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x53,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom face");
      return uVar1;
    }
    local_c8[0] = 11.0;
    local_c8[1] = 20.0;
    uVar1 = ref_geom_add(ref_geom,1,2,3,local_c8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x59,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom face");
      return uVar1;
    }
    local_c8[0] = 10.5;
    local_c8[1] = 21.0;
    uVar1 = ref_geom_add(ref_geom,2,2,3,local_c8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x5f,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom face");
      return uVar1;
    }
    uVar1 = ref_export_by_extension(local_d0,filename);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x61,"ref_gather_meshb_fixture",(ulong)uVar1,"export");
      return uVar1;
    }
    uVar1 = ref_grid_free(local_d0);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x62,"ref_gather_meshb_fixture",(ulong)uVar1,"free");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_meshb_fixture(REF_MPI ref_mpi,
                                                   const char *filename,
                                                   REF_INT version) {
  REF_GRID ref_grid;
  REF_GEOM ref_geom;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT type, id, node;
  REF_DBL param[2];

  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_fixture_tet_brick_grid(&ref_grid, ref_mpi), "set up tet");
    ref_grid_meshb_version(ref_grid) = version;
    ref_geom = ref_grid_geom(ref_grid);
    nodes[0] = 0;
    nodes[1] = 1;
    nodes[2] = 15;
    RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &cell), "add edge");
    type = REF_GEOM_NODE;
    id = 1;
    node = 0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom node");
    id = 2;
    node = 1;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom node");
    type = REF_GEOM_EDGE;
    id = 15;
    node = 0;
    param[0] = 10.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom edge");
    id = 15;
    node = 1;
    param[0] = 20.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom edge");
    type = REF_GEOM_FACE;
    id = 3;
    node = 0;
    param[0] = 10.0;
    param[1] = 20.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom face");
    type = REF_GEOM_FACE;
    id = 3;
    node = 1;
    param[0] = 11.0;
    param[1] = 20.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom face");
    type = REF_GEOM_FACE;
    id = 3;
    node = 2;
    param[0] = 10.5;
    param[1] = 21.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom face");

    RSS(ref_export_by_extension(ref_grid, filename), "export");
    RSS(ref_grid_free(ref_grid), "free");
  }
  return REF_SUCCESS;
}